

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::enqueueObjectsStandard(QPDFWriter *this)

{
  bool bVar1;
  element_type *peVar2;
  QPDFObjectHandle local_f0;
  reference local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *item;
  iterator __end1;
  iterator __begin1;
  Dictionary *__range1;
  string local_a8 [32];
  QPDFObjectHandle local_88;
  undefined1 local_78 [8];
  QPDFObjectHandle trailer;
  QPDFObjectHandle local_58;
  reference local_48;
  QPDFObjectHandle *oh;
  iterator __end2;
  iterator __begin2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range2;
  QPDFWriter *this_local;
  
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->preserve_unreferenced_objects & 1U) != 0) {
    QTC::TC("qpdf","QPDFWriter preserve unreferenced standard",0);
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    QPDF::getAllObjects((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2,
                        peVar2->pdf);
    __end2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2);
    oh = (QPDFObjectHandle *)
         std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                   ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                  *)&oh);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                 ::operator*(&__end2);
      QPDFObjectHandle::QPDFObjectHandle(&local_58,local_48);
      enqueueObject(this,&local_58);
      QPDFObjectHandle::~QPDFObjectHandle(&local_58);
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end2);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2);
  }
  getTrimmedTrailer((QPDFWriter *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"/Root",(allocator<char> *)((long)&__range1 + 7));
  QPDFObjectHandle::getKey(&local_88,(string *)local_78);
  enqueueObject(this,&local_88);
  QPDFObjectHandle::~QPDFObjectHandle(&local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin1,(typed)local_78);
  __end1 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin1);
  item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
          *)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin1);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&item);
    if (!bVar1) break;
    local_e0 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
               ::operator*(&__end1);
    bVar1 = ::qpdf::BaseHandle::null(&(local_e0->second).super_BaseHandle);
    if (!bVar1) {
      QPDFObjectHandle::QPDFObjectHandle(&local_f0,&local_e0->second);
      enqueueObject(this,&local_f0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_f0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
    ::operator++(&__end1);
  }
  ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin1);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
  return;
}

Assistant:

void
QPDFWriter::enqueueObjectsStandard()
{
    if (m->preserve_unreferenced_objects) {
        QTC::TC("qpdf", "QPDFWriter preserve unreferenced standard");
        for (auto const& oh: m->pdf.getAllObjects()) {
            enqueueObject(oh);
        }
    }

    // Put root first on queue.
    QPDFObjectHandle trailer = getTrimmedTrailer();
    enqueueObject(trailer.getKey("/Root"));

    // Next place any other objects referenced from the trailer dictionary into the queue, handling
    // direct objects recursively. Root is already there, so enqueuing it a second time is a no-op.
    for (auto& item: trailer.as_dictionary()) {
        if (!item.second.null()) {
            enqueueObject(item.second);
        }
    }
}